

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEPlanet.cpp
# Opt level: O1

void __thiscall CEPlanet::Update_JPL(CEPlanet *this,double new_jd)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  reference pvVar21;
  vector<double,_std::allocator<double>_> *this_00;
  double dVar22;
  double dVar23;
  double dVar24;
  double del_E;
  double E;
  double M;
  double e;
  double tdb2;
  double tdb1;
  double mjd;
  double local_a8;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  
  local_28 = CEDate::GetMJD2JDFactor();
  local_28 = new_jd - local_28;
  CEDate::UTC2TDB(&local_28,&local_30,&local_38);
  dVar23 = CppEphem::julian_date_J2000();
  dVar24 = ((local_30 + local_38) - dVar23) / 36525.0;
  dVar23 = ComputeElement(this,this->semi_major_axis_au_,this->semi_major_axis_au_per_cent_,dVar24);
  dVar1 = ComputeElement(this,this->eccentricity_,this->eccentricity_per_cent_,dVar24);
  local_40 = dVar1;
  dVar2 = ComputeElement(this,this->inclination_deg_,this->inclination_deg_per_cent_,dVar24);
  dVar3 = ComputeElement(this,this->mean_longitude_deg_,this->mean_longitude_deg_per_cent_,dVar24);
  dVar4 = ComputeElement(this,this->perihelion_lon_deg_,this->perihelion_long_deg_per_cent_,dVar24);
  dVar5 = ComputeElement(this,this->ascending_node_lon_deg_,this->ascending_node_lon_deg_per_cent_,
                         dVar24);
  dVar3 = MeanAnomaly(this,dVar3,dVar4,dVar24);
  local_48 = dVar3;
  dVar24 = sin(dVar3 * 0.017453292519943295);
  local_50 = dVar24 * dVar1 * 57.29577951308232 + dVar3;
  local_58 = 0.0;
  local_50 = EccentricAnomoly(this,&local_48,&local_40,&local_50,&local_58);
  dVar3 = local_50 * 0.017453292519943295;
  dVar24 = cos(dVar3);
  dVar24 = (dVar24 - dVar1) * dVar23;
  dVar1 = 1.0 - dVar1 * dVar1;
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
  }
  else {
    dVar1 = SQRT(dVar1);
  }
  dVar3 = sin(dVar3);
  dVar3 = dVar3 * dVar23 * dVar1;
  dVar23 = (dVar4 - dVar5) * 0.017453292519943295;
  dVar1 = cos(dVar23);
  dVar5 = dVar5 * 0.017453292519943295;
  dVar4 = cos(dVar5);
  dVar6 = sin(dVar23);
  dVar7 = sin(dVar5);
  dVar2 = dVar2 * 0.017453292519943295;
  dVar8 = cos(dVar2);
  local_a8 = sin(dVar23);
  local_a8 = -local_a8;
  dVar9 = cos(dVar5);
  dVar10 = cos(dVar23);
  dVar11 = sin(dVar5);
  dVar12 = cos(dVar2);
  dVar13 = cos(dVar23);
  dVar22 = sin(dVar5);
  dVar14 = sin(dVar23);
  dVar15 = cos(dVar5);
  dVar16 = cos(dVar2);
  dVar17 = sin(dVar23);
  dVar18 = sin(dVar5);
  dVar19 = cos(dVar23);
  dVar5 = cos(dVar5);
  dVar20 = cos(dVar2);
  dVar22 = (dVar22 * dVar13 + dVar16 * dVar15 * dVar14) * dVar24 +
           (dVar20 * dVar5 * dVar19 - dVar18 * dVar17) * dVar3;
  dVar5 = sin(dVar23);
  dVar13 = sin(dVar2);
  dVar23 = cos(dVar23);
  dVar2 = sin(dVar2);
  dVar23 = dVar13 * dVar5 * dVar24 + dVar2 * dVar23 * dVar3;
  this_00 = &this->pos_icrs_;
  pvVar21 = std::vector<double,_std::allocator<double>_>::operator[](this_00,0);
  *pvVar21 = (dVar4 * dVar1 - dVar7 * dVar6 * dVar8) * dVar24 +
             (dVar9 * local_a8 - dVar11 * dVar10 * dVar12) * dVar3;
  pvVar21 = std::vector<double,_std::allocator<double>_>::operator[](this_00,1);
  *pvVar21 = dVar22 * 0.9174821392082875 + dVar23 * -0.3977769780087639;
  pvVar21 = std::vector<double,_std::allocator<double>_>::operator[](this_00,2);
  *pvVar21 = dVar22 * 0.3977769780087639 + dVar23 * 0.9174821392082875;
  return;
}

Assistant:

void CEPlanet::Update_JPL(double new_jd) const
{
    /* Date has changed, so we need to recompute the coordinates of this object */

    // Compute the number of centuries since J2000 epoch
    double mjd = new_jd - CEDate::GetMJD2JDFactor();
    double tdb1;
    double tdb2;
    CEDate::UTC2TDB(mjd, &tdb1, &tdb2);
    double T = (tdb1+tdb2 - CppEphem::julian_date_J2000()) / DJC;

    // Compute the values
    double a = ComputeElement(semi_major_axis_au_, semi_major_axis_au_per_cent_, T) ;
    double e = ComputeElement(eccentricity_, eccentricity_per_cent_, T) ;
    double I = ComputeElement(inclination_deg_, inclination_deg_per_cent_, T) ;
    double L = ComputeElement(mean_longitude_deg_, mean_longitude_deg_per_cent_, T) ;
    double w = ComputeElement(perihelion_lon_deg_, perihelion_long_deg_per_cent_, T) ;
    double O = ComputeElement(ascending_node_lon_deg_, ascending_node_lon_deg_per_cent_, T) ;
    
    // Compute the argument of perihelion (W) and mean anomoly (M)
    double W = w - O ;
    double M = MeanAnomaly(L, w, T) ;
    
    // Iterate on the eccentric anomoly
    double E = M + e*DR2D * std::sin(M*DD2R) ;
    double del_E(0.0) ;
    E = EccentricAnomoly(M, e, E, del_E) ;
    
    // Compute the planets heliocentric coordinates in it's orbital plane
    double x_prime = a * (std::cos(E*DD2R) - e) ;
    double y_prime = a * std::sqrt(1.0 - (e*e)) * std::sin(E*DD2R) ;
//    double z_prime = 0.0 ;  // by definition
    
    // Transform the coordinates into the coordinates of the ecliptic
    double x_ecl = x_prime * (std::cos(W*DD2R)*std::cos(O*DD2R) - std::sin(W*DD2R)*std::sin(O*DD2R)*std::cos(I*DD2R)) +
                   y_prime * (-std::sin(W*DD2R)*std::cos(O*DD2R) - std::cos(W*DD2R)*std::sin(O*DD2R)*std::cos(I*DD2R)) ;
    double y_ecl = x_prime * (std::cos(W*DD2R)*std::sin(O*DD2R) + std::sin(W*DD2R)*std::cos(O*DD2R)*std::cos(I*DD2R)) +
                   y_prime * (-std::sin(W*DD2R)*std::sin(O*DD2R) + std::cos(W*DD2R)*std::cos(O*DD2R)*std::cos(I*DD2R)) ;
    double z_ecl = x_prime * (std::sin(W*DD2R)*std::sin(I*DD2R)) + y_prime * (std::cos(W*DD2R)*std::sin(I*DD2R)) ;
    
    // Convert from the ecliptic coordinates to ICRS
    double obl = DD2R * 23.43928 ;
    pos_icrs_[0] = x_ecl ;
    pos_icrs_[1] = y_ecl * std::cos(obl) - z_ecl * std::sin(obl) ;
    pos_icrs_[2] = y_ecl * std::sin(obl) + z_ecl * std::cos(obl) ;
}